

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Action_Request_R_PDU.cpp
# Opt level: O1

void __thiscall
KDIS::PDU::Action_Request_R_PDU::Decode
          (Action_Request_R_PDU *this,KDataStream *stream,bool ignoreHeader)

{
  vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FixedDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FixedDatum>_>_>
  *this_00;
  KUINT16 KVar1;
  uint uVar2;
  VariableDatum *pVVar3;
  KException *this_01;
  int iVar4;
  undefined7 in_register_00000011;
  ushort uVar5;
  KUINT32 datumID;
  uint local_6c;
  KString local_68;
  Action_Request_R_PDU *local_48;
  KUINT32 *local_40;
  KUINT32 *local_38;
  
  KVar1 = KDataStream::GetBufferSize(stream);
  iVar4 = 0xc;
  if ((int)CONCAT71(in_register_00000011,ignoreHeader) == 0) {
    iVar4 = 0;
  }
  if (0x2b < iVar4 + (uint)KVar1) {
    Simulation_Management_Header::Decode((Simulation_Management_Header *)this,stream,ignoreHeader);
    Reliability_Header::Decode(&this->super_Reliability_Header,stream);
    KDataStream::Read<unsigned_int>
              (stream,&(this->super_Action_Request_PDU).super_Data_PDU.m_ui32RequestID);
    KDataStream::Read<unsigned_int>(stream,&(this->super_Action_Request_PDU).m_ui32ActionID);
    local_38 = &(this->super_Action_Request_PDU).super_Data_PDU.super_Comment_PDU.
                m_ui32NumFixedDatum;
    KDataStream::Read<unsigned_int>(stream,local_38);
    local_40 = &(this->super_Action_Request_PDU).super_Data_PDU.super_Comment_PDU.
                m_ui32NumVariableDatum;
    KDataStream::Read<unsigned_int>(stream,local_40);
    local_48 = this;
    if ((this->super_Action_Request_PDU).super_Data_PDU.super_Comment_PDU.m_ui32NumFixedDatum != 0)
    {
      this_00 = &(this->super_Action_Request_PDU).super_Data_PDU.super_Comment_PDU.m_vFixedDatum;
      uVar5 = 1;
      do {
        KVar1 = KDataStream::GetCurrentWritePosition(stream);
        KDataStream::Read<unsigned_int>(stream,&local_6c);
        KDataStream::SetCurrentWritePosition(stream,KVar1);
        pVVar3 = (VariableDatum *)
                 DATA_TYPE::FactoryDecoderUser<KDIS::DATA_TYPE::FixedDatum>::FactoryDecode
                           (local_6c,stream);
        if (pVVar3 == (VariableDatum *)0x0) {
          pVVar3 = (VariableDatum *)operator_new(0x10);
          DATA_TYPE::FixedDatum::FixedDatum((FixedDatum *)pVVar3,stream);
          local_68._M_dataplus._M_p = (pointer)&PTR__KRef_Ptr_0022ba58;
          local_68._M_string_length = (size_type)pVVar3;
          local_68.field_2._M_allocated_capacity = (size_type)operator_new(2);
          *(undefined2 *)local_68.field_2._M_allocated_capacity = 1;
          std::
          vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FixedDatum>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FixedDatum>>>
          ::emplace_back<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FixedDatum>>
                    ((vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FixedDatum>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FixedDatum>>>
                      *)this_00,(KRef_Ptr<KDIS::DATA_TYPE::FixedDatum> *)&local_68);
        }
        else {
          local_68._M_dataplus._M_p = (pointer)&PTR__KRef_Ptr_0022ba58;
          local_68._M_string_length = (size_type)pVVar3;
          local_68.field_2._M_allocated_capacity = (size_type)operator_new(2);
          *(undefined2 *)local_68.field_2._M_allocated_capacity = 1;
          std::
          vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FixedDatum>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FixedDatum>>>
          ::emplace_back<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FixedDatum>>
                    ((vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FixedDatum>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FixedDatum>>>
                      *)this_00,(KRef_Ptr<KDIS::DATA_TYPE::FixedDatum> *)&local_68);
        }
        local_68._M_dataplus._M_p = (pointer)&PTR__KRef_Ptr_0022ba58;
        UTILS::KRef_Ptr<KDIS::DATA_TYPE::FixedDatum>::unRef
                  ((KRef_Ptr<KDIS::DATA_TYPE::FixedDatum> *)&local_68);
        uVar2 = (uint)uVar5;
        uVar5 = uVar5 + 1;
      } while (uVar2 < *local_38);
    }
    if (*local_40 != 0) {
      local_48 = (Action_Request_R_PDU *)
                 &(local_48->super_Action_Request_PDU).super_Data_PDU.super_Comment_PDU.
                  m_vVariableDatum;
      uVar5 = 1;
      do {
        KVar1 = KDataStream::GetCurrentWritePosition(stream);
        KDataStream::Read<unsigned_int>(stream,&local_6c);
        KDataStream::SetCurrentWritePosition(stream,KVar1);
        pVVar3 = DATA_TYPE::FactoryDecoderUser<KDIS::DATA_TYPE::VariableDatum>::FactoryDecode
                           (local_6c,stream);
        if (pVVar3 == (VariableDatum *)0x0) {
          pVVar3 = (VariableDatum *)operator_new(0x28);
          DATA_TYPE::VariableDatum::VariableDatum(pVVar3,stream);
          local_68._M_dataplus._M_p = (pointer)&PTR__KRef_Ptr_0022af40;
          local_68._M_string_length = (size_type)pVVar3;
          local_68.field_2._M_allocated_capacity = (size_type)operator_new(2);
          *(undefined2 *)local_68.field_2._M_allocated_capacity = 1;
          std::
          vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>>>
          ::emplace_back<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>>
                    ((vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>>>
                      *)local_48,(KRef_Ptr<KDIS::DATA_TYPE::VariableDatum> *)&local_68);
          local_68._M_dataplus._M_p = (pointer)&PTR__KRef_Ptr_0022af40;
          UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>::unRef
                    ((KRef_Ptr<KDIS::DATA_TYPE::VariableDatum> *)&local_68);
        }
        else {
          local_68._M_dataplus._M_p = (pointer)&PTR__KRef_Ptr_0022af40;
          local_68._M_string_length = (size_type)pVVar3;
          local_68.field_2._M_allocated_capacity = (size_type)operator_new(2);
          *(undefined2 *)local_68.field_2._M_allocated_capacity = 1;
          std::
          vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>>>
          ::emplace_back<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>>
                    ((vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>>>
                      *)local_48,(KRef_Ptr<KDIS::DATA_TYPE::VariableDatum> *)&local_68);
          local_68._M_dataplus._M_p = (pointer)&PTR__KRef_Ptr_0022af40;
          UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>::unRef
                    ((KRef_Ptr<KDIS::DATA_TYPE::VariableDatum> *)&local_68);
        }
        uVar2 = (uint)uVar5;
        uVar5 = uVar5 + 1;
      } while (uVar2 < *local_40);
    }
    return;
  }
  this_01 = (KException *)__cxa_allocate_exception(0x30);
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"Decode","");
  KException::KException(this_01,&local_68,2);
  __cxa_throw(this_01,&KException::typeinfo,KException::~KException);
}

Assistant:

void Action_Request_R_PDU::Decode(KDataStream &stream, bool ignoreHeader /*= true*/ ) noexcept(false)
{
    if( ( stream.GetBufferSize() + ( ignoreHeader ? Header::HEADER6_PDU_SIZE : 0 ) ) < ACTION_REQUEST_R_PDU_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    Simulation_Management_Header::Decode( stream, ignoreHeader );

    Reliability_Header::Decode( stream );

    stream >> m_ui32RequestID
           >> m_ui32ActionID
           >> m_ui32NumFixedDatum
           >> m_ui32NumVariableDatum;

    // FixedDatum
    for( KUINT16 i = 0; i < m_ui32NumFixedDatum; ++i )
    {
        // Save the current write position so we can peek.
        KUINT16 pos = stream.GetCurrentWritePosition();
        KUINT32 datumID;

        // Extract the datum id then reset the stream.
        stream >> datumID;
        stream.SetCurrentWritePosition( pos );

        // Use the factory decoder.
        FixedDatum * p = FixedDatum::FactoryDecode( datumID, stream );

        // Did we find a custom decoder? if not then use the default.
        if( p )
        {
            m_vFixedDatum.push_back( FixDtmPtr( p ) );
        }
        else
        {
            // Default
            m_vFixedDatum.push_back( FixDtmPtr( new FixedDatum( stream ) ) );
        }
    }

    // VariableDatum
    for( KUINT16 i = 0; i < m_ui32NumVariableDatum; ++i )
    {
        // Save the current write position so we can peek.
        KUINT16 pos = stream.GetCurrentWritePosition();
        KUINT32 datumID;

        // Extract the datum id then reset the stream.
        stream >> datumID;
        stream.SetCurrentWritePosition( pos );

        // Use the factory decoder.
        VariableDatum * p = VariableDatum::FactoryDecode( datumID, stream );

        // Did we find a custom decoder? if not then use the default.
        if( p )
        {
            m_vVariableDatum.push_back( VarDtmPtr( p ) );
        }
        else
        {
            // Default
            m_vVariableDatum.push_back( VarDtmPtr( new VariableDatum( stream ) ) );
        }
    }
}